

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout_mapping_right.hpp
# Opt level: O2

size_type __thiscall
std::experimental::detail::
layout_mapping_right_indexer<std::experimental::dimensions<1ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,1ul,void>
::operator()(void)

{
  value_type vVar1;
  value_type vVar2;
  unsigned_long in_stack_00000008;
  unsigned_long in_stack_00000010;
  unsigned_long in_stack_00000018;
  dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL> local_28;
  
  vVar1 = dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<unsigned_long>
                    ((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                      *)&stack0x00000008,1);
  local_28.dynamic_dims_._M_elems[2] = in_stack_00000018;
  local_28.dynamic_dims_._M_elems[0] = in_stack_00000008;
  local_28.dynamic_dims_._M_elems[1] = in_stack_00000010;
  vVar2 = dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<unsigned_long>(&local_28,0);
  return (vVar2 * 0x1e + vVar1) * 0x1e;
}

Assistant:

typename layout_mapping_right<Dimensions, Stepping, Padding>::size_type
    operator()(
        Dimensions d
      , Stepping step
      , Padding pad
      , dimensions<IdxDims...> i
        ) const noexcept
    {
        static_assert(
            (0                 <= N) 
          , "Dimension rank N is negative in layout_mapping_right."
        );
        static_assert(
            Dimensions::rank() >  N
          , "Dimension rank N is greater than the rank of Dimensions "
            "(out of bounds) in layout_mapping_right."
        );
        layout_mapping_right_indexer<Dimensions, Stepping, Padding, N + 1> const
            next;
        auto constexpr R = Dimensions::rank();
        return (d[R - N] * step[R - N] + pad[R - N])
             * (step[(R - 1) - N] * i[(R - 1) - N] + next(d, step, pad, i));
    }